

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CNewArrayExpression *exp)

{
  TypeInfo *left;
  IExpression *pIVar1;
  bool bVar2;
  TypeInfo *in_RCX;
  string *this_00;
  undefined1 auStack_78 [8];
  string local_70;
  string errorMessage;
  
  std::operator<<((ostream *)&std::cout,"typechecker: CNewArrayExpression\n");
  pIVar1 = (exp->lengthExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 != (IExpression *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    TypeInfo::TypeInfo((TypeInfo *)auStack_78,ERROR_TYPE);
    bVar2 = operator==(&this->lastCalculatedType,(TypeInfo *)auStack_78);
    std::__cxx11::string::~string((string *)(auStack_78 + 8));
    if (bVar2) {
      return;
    }
  }
  left = &this->lastCalculatedType;
  TypeInfo::TypeInfo((TypeInfo *)auStack_78,INT);
  bVar2 = operator!=(left,(TypeInfo *)auStack_78);
  std::__cxx11::string::~string((string *)(auStack_78 + 8));
  if (bVar2) {
    TypeInfo::TypeInfo((TypeInfo *)auStack_78,INT);
    CError::GetTypeErrorMessage_abi_cxx11_(&errorMessage,(CError *)auStack_78,left,in_RCX);
    std::__cxx11::string::~string((string *)(auStack_78 + 8));
    CError::CError((CError *)auStack_78,&errorMessage,
                   &(exp->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)auStack_78);
    std::__cxx11::string::~string((string *)auStack_78);
    TypeInfo::TypeInfo((TypeInfo *)auStack_78,ERROR_TYPE);
    TypeInfo::operator=(left,(TypeInfo *)auStack_78);
    std::__cxx11::string::~string((string *)(auStack_78 + 8));
    this_00 = &errorMessage;
  }
  else {
    TypeInfo::TypeInfo((TypeInfo *)auStack_78,INT_ARRAY);
    TypeInfo::operator=(left,(TypeInfo *)auStack_78);
    this_00 = (string *)(auStack_78 + 8);
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CNewArrayExpression &exp )
{
    std::cout << "typechecker: CNewArrayExpression\n";

    if ( exp.lengthExpression ) {
		exp.lengthExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
	}
	if( lastCalculatedType != enums::TPrimitiveType::INT ) {
		auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
		errors.push_back( CError( errorMessage, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
        return;
	}
    lastCalculatedType = enums::TPrimitiveType::INT_ARRAY;
}